

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O1

void av1_quantize_fp_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar10 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar10 = vpsubw_avx(*(undefined1 (*) [16])round_ptr,auVar10);
  auVar10 = vpsraw_avx(auVar10,1);
  auVar5 = vpermq_avx2(ZEXT1632(auVar10),0x54);
  auVar6 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])quant_ptr),0x54);
  auVar3 = vpaddw_avx2(auVar6,auVar6);
  auVar7 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])dequant_ptr),0x54);
  auVar14 = vpsraw_avx2(auVar7,2);
  auVar11 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar6 = vpabsw_avx2(auVar11);
  auVar16 = vpcmpgtw_avx2(auVar14,auVar6);
  if (((uint)(SUB321(auVar16 >> 7,0) & 1) | (uint)(SUB321(auVar16 >> 0xf,0) & 1) << 1 |
       (uint)(SUB321(auVar16 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar16 >> 0x1f,0) & 1) << 3 |
       (uint)(SUB321(auVar16 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar16 >> 0x2f,0) & 1) << 5 |
       (uint)(SUB321(auVar16 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar16 >> 0x3f,0) & 1) << 7 |
       (uint)(SUB321(auVar16 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar16 >> 0x4f,0) & 1) << 9 |
       (uint)(SUB321(auVar16 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar16 >> 0x5f,0) & 1) << 0xb |
       (uint)(SUB321(auVar16 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar16 >> 0x6f,0) & 1) << 0xd |
       (uint)(SUB321(auVar16 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar16 >> 0x7f,0) << 0xf |
       (uint)(SUB321(auVar16 >> 0x87,0) & 1) << 0x10 | (uint)(SUB321(auVar16 >> 0x8f,0) & 1) << 0x11
       | (uint)(SUB321(auVar16 >> 0x97,0) & 1) << 0x12 |
       (uint)(SUB321(auVar16 >> 0x9f,0) & 1) << 0x13 | (uint)(SUB321(auVar16 >> 0xa7,0) & 1) << 0x14
       | (uint)(SUB321(auVar16 >> 0xaf,0) & 1) << 0x15 |
       (uint)(SUB321(auVar16 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar16 >> 0xbf,0) << 0x17 |
       (uint)(SUB321(auVar16 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar16 >> 0xcf,0) & 1) << 0x19
       | (uint)(SUB321(auVar16 >> 0xd7,0) & 1) << 0x1a |
       (uint)(SUB321(auVar16 >> 0xdf,0) & 1) << 0x1b | (uint)(SUB321(auVar16 >> 0xe7,0) & 1) << 0x1c
       | (uint)(SUB321(auVar16 >> 0xef,0) & 1) << 0x1d |
       (uint)(SUB321(auVar16 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar16[0x1f] >> 7) << 0x1f) ==
      0xffffffff) {
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar11 = auVar12._0_32_;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar11;
    *(undefined1 (*) [32])qcoeff_ptr = auVar11;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar11;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar11;
  }
  else {
    auVar6 = vpaddsw_avx2(auVar6,auVar5);
    auVar6 = vpmulhuw_avx2(auVar6,auVar3);
    auVar15 = vpsignw_avx2(auVar6,auVar11);
    auVar16 = vpmullw_avx2(auVar6,auVar7);
    auVar16 = vpsrlw_avx2(auVar16,1);
    auVar11 = vpsignw_avx2(auVar16,auVar11);
    auVar16 = vpsraw_avx2(auVar15,0xf);
    auVar17 = vpunpcklwd_avx2(auVar15,auVar16);
    auVar16 = vpunpckhwd_avx2(auVar15,auVar16);
    *(undefined1 (*) [32])qcoeff_ptr = auVar17;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar16;
    auVar15 = vpsraw_avx2(auVar11,0xf);
    auVar16 = vpunpcklwd_avx2(auVar11,auVar15);
    auVar11 = vpunpckhwd_avx2(auVar11,auVar15);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar16;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar11;
    auVar11 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar6 = vpcmpgtw_avx2(auVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar11 = vpsubw_avx2(auVar11,auVar6);
    auVar11 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar11);
    auVar11 = vpand_avx2(auVar6,auVar11);
    auVar12 = ZEXT3264(auVar11);
  }
  auVar11 = auVar12._0_32_;
  if (0x10 < n_coeffs) {
    auVar6 = vpcmpeqd_avx2(auVar6,auVar6);
    auVar6 = vpaddw_avx2(auVar14,auVar6);
    auVar6 = vpermq_avx2(auVar6,0xee);
    auVar16 = vpermq_avx2(auVar7,0xee);
    auVar3 = vpermq_avx2(auVar3,0xee);
    auVar5 = vpermq_avx2(auVar5,0xee);
    lVar8 = n_coeffs + 0x10;
    lVar9 = 0;
    do {
      auVar7 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar9 * 2 + 0x40),
                              *(undefined1 (*) [32])((long)coeff_ptr + lVar9 * 2 + 0x60));
      auVar11 = vpabsw_avx2(auVar7);
      auVar14 = vpcmpgtw_avx2(auVar11,auVar6);
      auVar15 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar14 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar14 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar14 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar14 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar14 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar14 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar14 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar14 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar14 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar14 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar14 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar14 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar14 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar14 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar14 >> 0x7f,0) == '\0') &&
                        (auVar14 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar14 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar14 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar14 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar14 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar14 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar14 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar14 >> 0xbf,0) == '\0') &&
                (auVar14 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar14 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar14 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar14 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar14 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar14 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar14 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar14[0x1f])
      {
        pauVar1 = (undefined1 (*) [32])((long)dqcoeff_ptr + lVar9 * 2 + 0x40);
        pauVar2 = (undefined1 (*) [32])((long)qcoeff_ptr + lVar9 * 2 + 0x40);
        pauVar2[1] = auVar15;
        *pauVar2 = auVar15;
        pauVar1[1] = auVar15;
        *pauVar1 = auVar15;
      }
      else {
        auVar11 = vpaddsw_avx2(auVar11,auVar5);
        auVar11 = vpmulhuw_avx2(auVar11,auVar3);
        auVar17 = vpsignw_avx2(auVar11,auVar7);
        auVar14 = vpmullw_avx2(auVar11,auVar16);
        auVar14 = vpsrlw_avx2(auVar14,1);
        auVar7 = vpsignw_avx2(auVar14,auVar7);
        auVar14 = vpsraw_avx2(auVar17,0xf);
        auVar4 = vpunpcklwd_avx2(auVar17,auVar14);
        auVar14 = vpunpckhwd_avx2(auVar17,auVar14);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar9 * 2 + 0x40) = auVar4;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar9 * 2 + 0x60) = auVar14;
        auVar17 = vpsraw_avx2(auVar7,0xf);
        auVar14 = vpunpcklwd_avx2(auVar7,auVar17);
        auVar7 = vpunpckhwd_avx2(auVar7,auVar17);
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar9 * 2 + 0x40) = auVar14;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar9 * 2 + 0x60) = auVar7;
        auVar7 = vpermq_avx2(*(undefined1 (*) [32])((long)iscan_ptr + lVar9 + 0x20),0xd8);
        auVar11 = vpcmpgtw_avx2(auVar11,auVar15);
        auVar7 = vpsubw_avx2(auVar7,auVar11);
        auVar11 = vpand_avx2(auVar11,auVar7);
        auVar11 = vpmaxsw_avx2(auVar12._0_32_,auVar11);
        auVar12 = ZEXT3264(auVar11);
      }
      auVar11 = auVar12._0_32_;
      lVar9 = lVar9 + 0x20;
      lVar8 = lVar8 + -0x10;
    } while (0x20 < lVar8);
  }
  auVar10 = vpmaxsw_avx(auVar11._0_16_,auVar11._16_16_);
  auVar13._8_2_ = 0x7fff;
  auVar13._0_8_ = 0x7fff7fff7fff7fff;
  auVar13._10_2_ = 0x7fff;
  auVar13._12_2_ = 0x7fff;
  auVar13._14_2_ = 0x7fff;
  auVar10 = vpsubusw_avx(auVar13,auVar10);
  auVar10 = vphminposuw_avx(auVar10);
  *eob_ptr = auVar10._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_quantize_fp_32x32_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 1;
  const unsigned int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_32x32(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                    &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_32x32(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                      &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}